

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O3

void __thiscall crn::corpus_tester::add_bad_block(corpus_tester *this,image_u8 *block)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (this->m_bad_block_img).m_height;
  uVar3 = (this->m_bad_block_img).m_width + 3 >> 2;
  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::blit
            (&this->m_bad_block_img,(this->m_next_bad_block_index % uVar3) * 4,
             (this->m_next_bad_block_index / uVar3) * 4,block);
  uVar2 = this->m_next_bad_block_index + 1;
  this->m_next_bad_block_index = uVar2;
  if (uVar2 == (uVar1 + 3 >> 2) * uVar3) {
    flush_bad_blocks(this);
    return;
  }
  return;
}

Assistant:

void corpus_tester::add_bad_block(image_u8& block)
    {
        uint num_blocks_x = m_bad_block_img.get_block_width(4);
        uint num_blocks_y = m_bad_block_img.get_block_height(4);
        uint total_blocks = num_blocks_x * num_blocks_y;

        m_bad_block_img.blit((m_next_bad_block_index % num_blocks_x) * 4, (m_next_bad_block_index / num_blocks_x) * 4, block);
        m_next_bad_block_index++;

        if (m_next_bad_block_index == total_blocks)
        {
            flush_bad_blocks();
        }
    }